

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::Message>::destruct(BasicTypeInfo<dap::Message> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::Message> *this_local;
  
  Message::~Message((Message *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }